

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<double>_>::Read
          (TPZDohrAssembly<std::complex<double>_> *this,TPZStream *buf,void *context)

{
  TPZStream *in_RSI;
  long in_RDI;
  int nc;
  int ncoarse;
  int f;
  int nfine;
  TPZVec<int> *in_stack_ffffffffffffffb8;
  TPZVec<TPZVec<int>_> *in_stack_ffffffffffffffc0;
  TPZStream *this_00;
  int local_28;
  int local_24;
  int local_20;
  int local_1c [3];
  TPZStream *local_10;
  
  local_10 = in_RSI;
  (*in_RSI->_vptr_TPZStream[0x1d])(in_RSI,local_1c,1);
  TPZVec<TPZVec<int>_>::resize(in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8);
  for (local_20 = 0; local_20 < local_1c[0]; local_20 = local_20 + 1) {
    TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 8),(long)local_20);
    TPZStream::Read<int>((TPZStream *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  (*local_10->_vptr_TPZStream[0x1d])(local_10,&local_24,1);
  TPZVec<TPZVec<int>_>::resize(in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8);
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    this_00 = local_10;
    TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 0x28),(long)local_28);
    TPZStream::Read<int>(this_00,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Read(TPZStream &buf, void *context)
{
    int nfine;
    buf.Read(&nfine);
    fFineEqs.resize(nfine);
    for (int f=0; f<nfine; f++) {
        buf.Read( fFineEqs[f]);
    }
    int ncoarse;
    buf.Read(&ncoarse);
    fCoarseEqs.resize(ncoarse);
    for (int nc=0; nc<ncoarse; nc++) {
        buf.Read( fCoarseEqs[nc]);
    }    
}